

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O1

void predict_iforest<float,int>
               (float *numeric_data,int *categ_data,bool is_col_major,size_t ld_numeric,
               size_t ld_categ,float *Xc,int *Xc_ind,int *Xc_indptr,float *Xr,int *Xr_ind,
               int *Xr_indptr,size_t nrows,int nthreads,bool standardize,IsoForest *model_outputs,
               ExtIsoForest *model_outputs_ext,double *output_depths,int *tree_num,
               double *per_tree_depths,TreesIndexer *indexer)

{
  pointer pSVar1;
  pointer pvVar2;
  pointer puVar3;
  void *__tmp;
  size_t sVar4;
  ulong uVar5;
  double *pdVar6;
  ExtIsoForest *pEVar7;
  undefined8 uVar8;
  int *piVar9;
  long lVar10;
  int *piVar11;
  size_t row_00;
  double *pdVar12;
  pointer pvVar13;
  pointer pvVar14;
  undefined4 uVar15;
  uint7 uVar18;
  double *pdVar16;
  long lVar17;
  double *pdVar19;
  long lVar20;
  size_t row;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  double dVar25;
  undefined1 auVar26 [16];
  PredictionData<float,_int> prediction_data;
  double local_f8;
  size_t local_f0;
  double *local_e8;
  double dStack_e0;
  size_t local_d0;
  long local_c8;
  long local_c0 [2];
  int local_ac;
  size_t local_a8;
  int *local_a0;
  ulong local_98;
  PredictionData<float,_int> local_90;
  
  if (nrows == 0) {
    return;
  }
  local_90.nrows = nrows;
  local_90.Xc_ind = Xc_ind;
  local_90.Xc_indptr = Xc_indptr;
  local_90.Xr = Xr;
  local_90.Xr_ind = Xr_ind;
  local_90.Xr_indptr = Xr_indptr;
  local_ac = (int)nrows;
  if ((ulong)(long)nthreads <= nrows) {
    local_ac = nthreads;
  }
  uVar18 = (uint7)((ulong)Xr >> 8);
  pdVar16 = (double *)((ulong)uVar18 << 8);
  local_a0 = categ_data;
  local_90.numeric_data = numeric_data;
  local_90.categ_data = categ_data;
  local_90.is_col_major = is_col_major;
  local_90.ncols_numeric = ld_numeric;
  local_90.ncols_categ = ld_categ;
  local_90.Xc = Xc;
  if ((categ_data == (int *)0x0 || is_col_major) && Xc_indptr != (int *)0x0) {
    pdVar16 = output_depths;
    batched_csc_predict<float,int>
              (&local_90,nthreads,model_outputs,model_outputs_ext,output_depths,tree_num,
               per_tree_depths);
  }
  else if (model_outputs == (IsoForest *)0x0) {
    if ((((Xc_indptr == (int *)0x0) && (Xr_indptr == (int *)0x0)) && (categ_data == (int *)0x0)) &&
       ((model_outputs_ext->missing_action == Fail &&
        (model_outputs_ext->has_range_penalty == false)))) {
      if (nrows == 1 || !is_col_major) {
        local_e8 = (double *)(nrows * 4);
        lVar10 = 0;
        sVar4 = 0;
        do {
          local_f8 = 0.0;
          pvVar13 = (model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar20 = (long)(model_outputs_ext->hplanes).
                         super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13;
          if (lVar20 != 0) {
            uVar5 = (lVar20 >> 3) * -0x5555555555555555;
            lVar20 = 0;
            uVar21 = 0;
            pdVar12 = per_tree_depths;
            pdVar6 = (double *)tree_num;
            do {
              pdVar16 = pdVar6;
              if (tree_num == (int *)0x0) {
                pdVar16 = (double *)tree_num;
              }
              pdVar19 = (double *)(uVar5 * lVar10 + (long)pdVar12);
              if (per_tree_depths == (double *)0x0) {
                pdVar19 = (double *)0x0;
              }
              traverse_hplane_fast_rowmajor<float,int>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&(pvVar13->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>
                                 )._M_impl + lVar20),model_outputs_ext,
                         local_90.numeric_data + local_90.ncols_numeric * sVar4,&local_f8,
                         (int *)pdVar16,pdVar19,sVar4);
              uVar21 = uVar21 + 1;
              pvVar13 = (model_outputs_ext->hplanes).
                        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar5 = ((long)(model_outputs_ext->hplanes).
                             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3) *
                      -0x5555555555555555;
              pdVar6 = (double *)((long)pdVar6 + (long)local_e8);
              pdVar12 = pdVar12 + 1;
              lVar20 = lVar20 + 0x18;
            } while (uVar21 < uVar5);
          }
          output_depths[sVar4] = local_f8;
          sVar4 = sVar4 + 1;
          lVar10 = lVar10 + 8;
        } while (sVar4 != nrows);
      }
      else {
        local_e8 = (double *)(nrows * 4);
        lVar10 = 0;
        sVar4 = 0;
        do {
          local_f8 = 0.0;
          pvVar13 = (model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar20 = (long)(model_outputs_ext->hplanes).
                         super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13;
          if (lVar20 != 0) {
            uVar5 = (lVar20 >> 3) * -0x5555555555555555;
            lVar20 = 0;
            uVar21 = 0;
            pdVar12 = (double *)tree_num;
            pdVar6 = per_tree_depths;
            do {
              pdVar16 = pdVar12;
              if (tree_num == (int *)0x0) {
                pdVar16 = (double *)tree_num;
              }
              pdVar19 = (double *)(uVar5 * lVar10 + (long)pdVar6);
              if (per_tree_depths == (double *)0x0) {
                pdVar19 = (double *)0x0;
              }
              traverse_hplane_fast_colmajor<PredictionData<float,int>,int>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&(pvVar13->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>
                                 )._M_impl + lVar20),model_outputs_ext,&local_90,&local_f8,
                         (int *)pdVar16,pdVar19,sVar4);
              uVar21 = uVar21 + 1;
              pvVar13 = (model_outputs_ext->hplanes).
                        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar5 = ((long)(model_outputs_ext->hplanes).
                             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3) *
                      -0x5555555555555555;
              pdVar12 = (double *)((long)pdVar12 + (long)local_e8);
              pdVar6 = pdVar6 + 1;
              lVar20 = lVar20 + 0x18;
            } while (uVar21 < uVar5);
          }
          output_depths[sVar4] = local_f8;
          sVar4 = sVar4 + 1;
          lVar10 = lVar10 + 8;
        } while (sVar4 != nrows);
      }
    }
    else {
      local_d0 = nrows + (nrows == 0);
      local_f0 = nrows * 4;
      sVar4 = 0;
      local_e8 = (double *)0x0;
      do {
        local_f8 = 0.0;
        pvVar13 = (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = (long)(model_outputs_ext->hplanes).
                       super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13;
        if (lVar10 != 0) {
          uVar5 = (lVar10 >> 3) * -0x5555555555555555;
          lVar10 = 0;
          uVar21 = 0;
          piVar11 = tree_num;
          pdVar16 = per_tree_depths;
          do {
            piVar9 = piVar11;
            if (tree_num == (int *)0x0) {
              piVar9 = tree_num;
            }
            pdVar12 = (double *)(uVar5 * (long)local_e8 + (long)pdVar16);
            if (per_tree_depths == (double *)0x0) {
              pdVar12 = (double *)0x0;
            }
            traverse_hplane<PredictionData<float,int>,int,ImputedData<int,double>>
                      ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                       ((long)&(pvVar13->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>).
                               _M_impl + lVar10),model_outputs_ext,&local_90,&local_f8,
                       (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                       (ImputedData<int,_double> *)0x0,piVar9,pdVar12,sVar4);
            uVar21 = uVar21 + 1;
            pvVar13 = (model_outputs_ext->hplanes).
                      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar5 = ((long)(model_outputs_ext->hplanes).
                           super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3) *
                    -0x5555555555555555;
            piVar11 = (int *)((long)piVar11 + local_f0);
            pdVar16 = pdVar16 + 1;
            lVar10 = lVar10 + 0x18;
          } while (uVar21 < uVar5);
        }
        output_depths[sVar4] = local_f8;
        sVar4 = sVar4 + 1;
        pdVar16 = local_e8 + 1;
        local_e8 = pdVar16;
      } while (sVar4 != local_d0);
    }
  }
  else {
    if (model_outputs->missing_action == Fail) {
      if (model_outputs->new_cat_action == Weighted) {
        bVar22 = model_outputs->cat_split_type == SingleCateg;
        pdVar16 = (double *)CONCAT71(uVar18,bVar22);
        if (((Xc_indptr == (int *)0x0) && (Xr_indptr == (int *)0x0)) &&
           (categ_data == (int *)0x0 || bVar22)) goto LAB_0014869d;
      }
      else if (Xc_indptr == (int *)0x0 && Xr_indptr == (int *)0x0) {
LAB_0014869d:
        if (model_outputs->has_range_penalty == false) {
          local_f0 = nrows + (nrows == 0);
          if ((nrows == 1 || !is_col_major) && categ_data == (int *)0x0) {
            local_d0 = nrows * 4;
            local_e8 = (double *)0x0;
            sVar4 = 0;
            do {
              local_f8 = 0.0;
              pvVar14 = (model_outputs->trees).
                        super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar10 = (long)(model_outputs->trees).
                             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar14;
              if (lVar10 != 0) {
                uVar5 = (lVar10 >> 3) * -0x5555555555555555;
                lVar10 = 0;
                uVar21 = 0;
                pdVar12 = per_tree_depths;
                pdVar6 = (double *)tree_num;
                do {
                  pdVar16 = pdVar6;
                  if (tree_num == (int *)0x0) {
                    pdVar16 = (double *)tree_num;
                  }
                  pdVar19 = (double *)(uVar5 * (long)local_e8 + (long)pdVar12);
                  if (per_tree_depths == (double *)0x0) {
                    pdVar19 = (double *)0x0;
                  }
                  traverse_itree_fast<float,int>
                            ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                             ((long)&(pvVar14->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>
                                     )._M_impl + lVar10),model_outputs,
                             local_90.numeric_data + local_90.ncols_numeric * sVar4,&local_f8,
                             (int *)pdVar16,pdVar19,sVar4);
                  uVar21 = uVar21 + 1;
                  pvVar14 = (model_outputs->trees).
                            super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar5 = ((long)(model_outputs->trees).
                                 super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar14 >> 3) *
                          -0x5555555555555555;
                  pdVar6 = (double *)((long)pdVar6 + local_d0);
                  pdVar12 = pdVar12 + 1;
                  lVar10 = lVar10 + 0x18;
                } while (uVar21 < uVar5);
              }
              output_depths[sVar4] = local_f8;
              sVar4 = sVar4 + 1;
              local_e8 = (double *)((long)local_e8 + 8);
            } while (sVar4 != local_f0);
          }
          else {
            local_d0 = nrows * 4;
            lVar10 = 0;
            local_e8 = (double *)0x0;
            do {
              local_f8 = 0.0;
              pvVar14 = (model_outputs->trees).
                        super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar20 = (long)(model_outputs->trees).
                             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar14;
              if (lVar20 != 0) {
                uVar5 = (lVar20 >> 3) * -0x5555555555555555;
                lVar20 = 0;
                uVar21 = 0;
                pdVar12 = (double *)tree_num;
                pdVar6 = per_tree_depths;
                do {
                  pdVar16 = pdVar12;
                  if (tree_num == (int *)0x0) {
                    pdVar16 = (double *)tree_num;
                  }
                  pdVar19 = (double *)(uVar5 * lVar10 + (long)pdVar6);
                  if (per_tree_depths == (double *)0x0) {
                    pdVar19 = (double *)0x0;
                  }
                  traverse_itree_no_recurse<PredictionData<float,int>,int>
                            ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                             ((long)&(pvVar14->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>
                                     )._M_impl + lVar20),model_outputs,&local_90,&local_f8,
                             (int *)pdVar16,pdVar19,(size_t)local_e8);
                  uVar21 = uVar21 + 1;
                  pvVar14 = (model_outputs->trees).
                            super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar5 = ((long)(model_outputs->trees).
                                 super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar14 >> 3) *
                          -0x5555555555555555;
                  pdVar12 = (double *)((long)pdVar12 + local_d0);
                  pdVar6 = pdVar6 + 1;
                  lVar20 = lVar20 + 0x18;
                } while (uVar21 < uVar5);
              }
              output_depths[(long)local_e8] = local_f8;
              local_e8 = (double *)((long)local_e8 + 1);
              lVar10 = lVar10 + 8;
            } while (local_e8 != (double *)local_f0);
          }
          goto LAB_0014818e;
        }
      }
    }
    sVar4 = nrows + (nrows == 0);
    local_c8 = 0;
    local_d0 = nrows * 4;
    local_f0 = 0;
    uVar5 = 0;
    row_00 = 0;
    local_a8 = sVar4;
    do {
      if ((uVar5 & 1) == 0) {
        pvVar14 = (model_outputs->trees).
                  super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = (long)(model_outputs->trees).
                       super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar14;
        local_98 = uVar5;
        if (lVar10 == 0) {
          dVar25 = 0.0;
        }
        else {
          uVar5 = (lVar10 >> 3) * -0x5555555555555555;
          dVar25 = 0.0;
          lVar10 = 0;
          uVar21 = 0;
          piVar11 = tree_num;
          pdVar12 = per_tree_depths;
          do {
            piVar9 = piVar11;
            if (tree_num == (int *)0x0) {
              piVar9 = tree_num;
            }
            pdVar6 = (double *)(uVar5 * local_f0 + (long)pdVar12);
            if (per_tree_depths == (double *)0x0) {
              pdVar6 = (double *)0x0;
            }
            pdVar16 = (double *)0x0;
            local_e8 = (double *)dVar25;
            dVar25 = traverse_itree<PredictionData<float,int>,int,ImputedData<int,double>>
                               ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                                ((long)&(pvVar14->
                                        super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                                        _M_impl + lVar10),model_outputs,&local_90,
                                (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                                (ImputedData<int,_double> *)0x0,0.0,row_00,piVar9,pdVar6,0);
            dVar25 = (double)local_e8 + dVar25;
            uVar21 = uVar21 + 1;
            pvVar14 = (model_outputs->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar5 = ((long)(model_outputs->trees).
                           super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar14 >> 3) *
                    -0x5555555555555555;
            piVar11 = (int *)((long)piVar11 + local_d0);
            pdVar12 = pdVar12 + 1;
            lVar10 = lVar10 + 0x18;
          } while (uVar21 < uVar5);
        }
        output_depths[row_00] = dVar25;
        sVar4 = local_a8;
        uVar5 = local_98;
      }
      row_00 = row_00 + 1;
      local_f0 = local_f0 + 8;
    } while (row_00 != sVar4);
    if ((uVar5 & 1) != 0) {
      local_c0[0] = local_c8;
      if (local_c8 != 0) {
        std::__exception_ptr::exception_ptr::_M_addref();
      }
      uVar8 = std::rethrow_exception((exception_ptr)local_c0);
      if (local_c8 != 0) {
        std::__exception_ptr::exception_ptr::_M_release();
      }
      _Unwind_Resume(uVar8);
    }
    if (local_c8 != 0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
  }
LAB_0014818e:
  pEVar7 = (ExtIsoForest *)model_outputs;
  if (model_outputs == (IsoForest *)0x0) {
    pEVar7 = model_outputs_ext;
  }
  lVar10 = ((long)(pEVar7->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pEVar7->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if ((model_outputs == (IsoForest *)0x0) ||
     (bVar22 = true, model_outputs->scoring_metric != Density)) {
    if (model_outputs_ext == (ExtIsoForest *)0x0) {
      bVar22 = false;
    }
    else {
      bVar22 = model_outputs_ext->scoring_metric == Density;
    }
  }
  auVar26._8_4_ = (int)((ulong)lVar10 >> 0x20);
  auVar26._0_8_ = lVar10;
  auVar26._12_4_ = 0x45300000;
  if ((model_outputs == (IsoForest *)0x0) ||
     (bVar23 = true, model_outputs->scoring_metric != BoxedRatio)) {
    if (model_outputs_ext == (ExtIsoForest *)0x0) {
      bVar23 = false;
    }
    else {
      bVar23 = model_outputs_ext->scoring_metric == BoxedRatio;
    }
  }
  dStack_e0 = auVar26._8_8_ - 1.9342813113834067e+25;
  if (model_outputs != (IsoForest *)0x0) {
    pdVar16 = (double *)CONCAT71((int7)((ulong)pdVar16 >> 8),1);
    uVar15 = SUB84(pdVar16,0);
    if (model_outputs->scoring_metric == BoxedDensity) goto LAB_0014823a;
  }
  if (model_outputs_ext == (ExtIsoForest *)0x0) {
    uVar15 = 0;
  }
  else {
    uVar15 = (undefined4)
             CONCAT71((int7)((ulong)pdVar16 >> 8),model_outputs_ext->scoring_metric == BoxedDensity)
    ;
  }
LAB_0014823a:
  if ((model_outputs == (IsoForest *)0x0) ||
     (bVar24 = true, model_outputs->scoring_metric != BoxedDensity2)) {
    if (model_outputs_ext == (ExtIsoForest *)0x0) {
      bVar24 = false;
    }
    else {
      bVar24 = model_outputs_ext->scoring_metric == BoxedDensity2;
    }
  }
  local_e8 = (double *)(dStack_e0 + ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0))
  ;
  local_f0 = CONCAT44(local_f0._4_4_,uVar15);
  if (standardize) {
    if (bVar22 || bVar24) {
      lVar10 = 0;
      do {
        output_depths[lVar10] = output_depths[lVar10] / -(double)local_e8;
        lVar10 = lVar10 + 1;
      } while (nrows + (nrows == 0) != lVar10);
    }
    else {
      lVar10 = nrows + (nrows == 0);
      if ((char)uVar15 == '\0') {
        if (bVar23) {
          lVar20 = 0;
          do {
            output_depths[lVar20] = output_depths[lVar20] / (double)local_e8;
            lVar20 = lVar20 + 1;
          } while (lVar10 != lVar20);
        }
        else {
          local_e8 = (double *)((double)local_e8 * pEVar7->exp_avg_depth);
          lVar20 = 0;
          do {
            dVar25 = exp2(-output_depths[lVar20] / (double)local_e8);
            output_depths[lVar20] = dVar25;
            lVar20 = lVar20 + 1;
          } while (lVar10 != lVar20);
        }
      }
      else {
        lVar20 = 0;
        do {
          dVar25 = exp(output_depths[lVar20] / (double)local_e8);
          output_depths[lVar20] = -dVar25;
          lVar20 = lVar20 + 1;
        } while (lVar10 != lVar20);
      }
    }
  }
  else if ((bVar22 || (char)uVar15 != '\0') || bVar24) {
    lVar10 = 0;
    do {
      dVar25 = exp(output_depths[lVar10] / (double)local_e8);
      output_depths[lVar10] = dVar25;
      lVar10 = lVar10 + 1;
    } while (nrows + (nrows == 0) != lVar10);
  }
  else if (bVar23) {
    lVar10 = 0;
    do {
      output_depths[lVar10] = output_depths[lVar10] / -(double)local_e8;
      lVar10 = lVar10 + 1;
    } while (nrows + (nrows == 0) != lVar10);
  }
  else {
    lVar10 = 0;
    do {
      output_depths[lVar10] = output_depths[lVar10] / (double)local_e8;
      lVar10 = lVar10 + 1;
    } while (nrows + (nrows == 0) != lVar10);
  }
  if ((per_tree_depths != (double *)0x0) && ((bVar22 || (local_f0 & 1) != 0) || bVar24)) {
    pEVar7 = (ExtIsoForest *)model_outputs;
    if (model_outputs == (IsoForest *)0x0) {
      pEVar7 = model_outputs_ext;
    }
    lVar10 = nrows * -0x5555555555555555 *
             ((long)(pEVar7->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pEVar7->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    if (lVar10 != 0) {
      lVar20 = 0;
      do {
        dVar25 = exp(per_tree_depths[lVar20]);
        per_tree_depths[lVar20] = dVar25;
        lVar20 = lVar20 + 1;
      } while (lVar10 - lVar20 != 0);
    }
  }
  if (tree_num != (int *)0x0) {
    if ((indexer != (TreesIndexer *)0x0) &&
       (pSVar1 = (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_start,
       pSVar1 != (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_finish)) {
      pEVar7 = (ExtIsoForest *)model_outputs;
      if (model_outputs == (IsoForest *)0x0) {
        pEVar7 = model_outputs_ext;
      }
      pvVar13 = (pEVar7->hplanes).
                super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (pEVar7->hplanes).
               super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((model_outputs == (IsoForest *)0x0) ||
         ((model_outputs->missing_action != Divide &&
          (((model_outputs->new_cat_action != Weighted || (local_a0 == (int *)0x0)) ||
           (model_outputs->cat_split_type != SubSet)))))) {
        if (pvVar2 == pvVar13) {
          return;
        }
        lVar20 = ((long)pvVar2 - (long)pvVar13 >> 3) * -0x5555555555555555;
        lVar10 = 0;
        do {
          puVar3 = pSVar1[lVar10].terminal_node_mappings.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar17 = 0;
          do {
            tree_num[lVar17] = (int)puVar3[tree_num[lVar17]];
            lVar17 = lVar17 + 1;
          } while (nrows + (nrows == 0) != lVar17);
          lVar10 = lVar10 + 1;
          tree_num = tree_num + nrows;
        } while (lVar10 != lVar20 + (ulong)(lVar20 == 0));
        return;
      }
    }
    remap_terminal_trees<PredictionData<float,int>,int>
              (model_outputs,model_outputs_ext,&local_90,tree_num,local_ac);
  }
  return;
}

Assistant:

void predict_iforest(real_t *restrict numeric_data, int *restrict categ_data,
                     bool is_col_major, size_t ld_numeric, size_t ld_categ,
                     real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     real_t *restrict Xr, sparse_ix *restrict Xr_ind, sparse_ix *restrict Xr_indptr,
                     size_t nrows, int nthreads, bool standardize,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double *restrict output_depths,   sparse_ix *restrict tree_num,
                     double *restrict per_tree_depths,
                     TreesIndexer *indexer)
{
    if (unlikely(!nrows)) return;

    /* put data in a struct for passing it in fewer lines */
    PredictionData<real_t, sparse_ix>
                   prediction_data = {numeric_data, categ_data, nrows,
                                      is_col_major, ld_numeric, ld_categ,
                                      Xc, Xc_ind, Xc_indptr,
                                      Xr, Xr_ind, Xr_indptr};

    int nthreads_orig = nthreads;
    if ((size_t)nthreads > nrows)
        nthreads = nrows;

    /* For batch predictions of sparse CSC, will take a specialized route */
    if (prediction_data.Xc_indptr != NULL && (prediction_data.categ_data == NULL || prediction_data.is_col_major))
    {
        batched_csc_predict(prediction_data, nthreads_orig,
                            model_outputs, model_outputs_ext,
                            output_depths, tree_num,
                            per_tree_depths);
    }

    /* Regular case (no specialized CSC route) */
    else if (model_outputs != NULL)
    {
        if (
            model_outputs->missing_action == Fail &&
            (model_outputs->new_cat_action != Weighted || model_outputs->cat_split_type == SingleCateg || prediction_data.categ_data == NULL) &&
            prediction_data.Xc_indptr == NULL && prediction_data.Xr_indptr == NULL &&
            !model_outputs->has_range_penalty
            )
        {
            if (prediction_data.categ_data == NULL && (nrows == 1 || !prediction_data.is_col_major))
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs->trees.size(); tree++)
                    {
                        traverse_itree_fast(model_outputs->trees[tree],
                                            *model_outputs,
                                            prediction_data.numeric_data + row * prediction_data.ncols_numeric,
                                            score,
                                            (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                            (per_tree_depths == NULL)?
                                                NULL : (per_tree_depths + tree + row*model_outputs->trees.size()),
                                            (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }

            else
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs->trees.size(); tree++)
                    {
                        traverse_itree_no_recurse(model_outputs->trees[tree],
                                                  *model_outputs,
                                                  prediction_data,
                                                  score,
                                                  (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                  (per_tree_depths == NULL)?
                                                      NULL : (per_tree_depths + tree + row*model_outputs->trees.size()),
                                                  (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }
        }

        else
        {
            bool threw_exception = false;
            std::exception_ptr ex = NULL;

            #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                    shared(nrows, model_outputs, prediction_data, output_depths, tree_num, per_tree_depths, threw_exception, ex)
            for (size_t_for row = 0; row < (decltype(row))nrows; row++)
            {
                if (threw_exception) continue;
                double score = 0;
                try
                {
                    for (size_t tree = 0; tree < model_outputs->trees.size(); tree++)
                    {
                        score += traverse_itree(model_outputs->trees[tree],
                                                *model_outputs,
                                                prediction_data,
                                                (std::vector<ImputeNode>*)NULL,
                                                (ImputedData<sparse_ix, double>*)NULL,
                                                (double)0,
                                                (size_t) row,
                                                (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                (per_tree_depths == NULL)?
                                                    NULL : (per_tree_depths + tree + row*model_outputs->trees.size()),
                                                (size_t) 0);
                    }
                    output_depths[row] = score;
                }
                catch (...)
                {
                    #pragma omp critical
                    {
                        if (!threw_exception)
                        {
                            threw_exception = true;
                            ex = std::current_exception();
                        }
                    }
                }
            }

            if (threw_exception)
                std::rethrow_exception(ex);
        }
    }
    

    else
    {
        if (
            model_outputs_ext->missing_action == Fail &&
            prediction_data.categ_data == NULL &&
            prediction_data.Xc_indptr == NULL &&
            prediction_data.Xr_indptr == NULL &&
            !model_outputs_ext->has_range_penalty
            )
        {
            if (prediction_data.is_col_major && nrows > 1)
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs_ext, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs_ext->hplanes.size(); tree++)
                    {
                        traverse_hplane_fast_colmajor(model_outputs_ext->hplanes[tree],
                                                      *model_outputs_ext,
                                                      prediction_data,
                                                      score,
                                                      (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                      (per_tree_depths == NULL)?
                                                            NULL : (per_tree_depths + tree + row*model_outputs_ext->hplanes.size()),
                                                      (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }

            else
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs_ext, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs_ext->hplanes.size(); tree++)
                    {
                        traverse_hplane_fast_rowmajor(model_outputs_ext->hplanes[tree],
                                                      *model_outputs_ext,
                                                      prediction_data.numeric_data + row * prediction_data.ncols_numeric,
                                                      score,
                                                      (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                      (per_tree_depths == NULL)?
                                                            NULL : (per_tree_depths + tree + row*model_outputs_ext->hplanes.size()),
                                                      (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }
        }

        else
        {
            #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                    shared(nrows, model_outputs_ext, prediction_data, output_depths, tree_num, per_tree_depths)
            for (size_t_for row = 0; row < (decltype(row))nrows; row++)
            {
                double score = 0;
                for (size_t tree = 0; tree < model_outputs_ext->hplanes.size(); tree++)
                {
                    traverse_hplane(model_outputs_ext->hplanes[tree],
                                    *model_outputs_ext,
                                    prediction_data,
                                    score,
                                    (std::vector<ImputeNode>*)NULL,
                                    (ImputedData<sparse_ix, double>*)NULL,
                                    (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                    (per_tree_depths == NULL)?
                                        NULL : (per_tree_depths + tree + row*model_outputs_ext->hplanes.size()),
                                    (size_t) row);
                }
                output_depths[row] = score;
            }
        }
    }

    /* translate sum-of-depths to outlier score */
    double ntrees, depth_divisor;
    if (model_outputs != NULL)
    {
        ntrees = (double) model_outputs->trees.size();
        depth_divisor = ntrees * (model_outputs->exp_avg_depth);
    }

    else
    {
        ntrees = (double) model_outputs_ext->hplanes.size();
        depth_divisor = ntrees * (model_outputs_ext->exp_avg_depth);
    }

    
    /* for density and boxed_ratio, each tree will have 'log(d)'' instead of 'd' */
    bool is_density = (model_outputs != NULL && model_outputs->scoring_metric == Density) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == Density);
    bool is_bratio  = (model_outputs != NULL && model_outputs->scoring_metric == BoxedRatio) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == BoxedRatio);
    bool is_bdens   = (model_outputs != NULL && model_outputs->scoring_metric == BoxedDensity) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == BoxedDensity);
    bool is_bdens2  = (model_outputs != NULL && model_outputs->scoring_metric == BoxedDensity2) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == BoxedDensity2);

    if (standardize)
    {
        if (is_density || is_bdens2)
        {
            ntrees = -ntrees;
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] /= ntrees;
        }

        else if (is_bdens)
        {
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = -std::exp(output_depths[row] / ntrees);
        }

        else if (is_bratio)
        {
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = output_depths[row] / ntrees;
        }

        else
        {
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = std::exp2( - output_depths[row] / depth_divisor );
        }
    }

    else
    {
        if (is_density || is_bdens || is_bdens2)
        {
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = std::exp(output_depths[row] / ntrees);
        }

        else if (is_bratio)
        {
            ntrees = -ntrees;
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] /= ntrees;
        }

        else
        {
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] /= ntrees;
        }
    }

    if (per_tree_depths != NULL && (is_density || is_bdens || is_bdens2))
    {
        size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
        #ifndef _WIN32
        #pragma omp simd
        #endif
        for (size_t ix = 0; ix < nrows*ntrees; ix++)
            per_tree_depths[ix] = std::exp(per_tree_depths[ix]);
    }


    /* re-map tree numbers to start at zero (if predicting tree numbers) */
    /* Note: usually this type of 'prediction' is not required,
       thus this mapping is not stored in the model objects so as to
       save memory */
    if (tree_num != NULL)
    {
        if (indexer != NULL && !indexer->indices.empty())
        {
            size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
            if (model_outputs != NULL)
            {
                if (model_outputs->missing_action == Divide)
                    goto manual_remap;
                if (model_outputs->new_cat_action == Weighted && model_outputs->cat_split_type == SubSet && categ_data != NULL)
                    goto manual_remap;
            }

            for (size_t tree = 0; tree < ntrees; tree++)
            {
                size_t *restrict mapping = indexer->indices[tree].terminal_node_mappings.data();
                for (size_t row = 0; row < nrows; row++)
                {
                    tree_num[row + tree*nrows] = mapping[tree_num[row + tree*nrows]];
                }
            }
        }

        else
        {
            manual_remap:
            remap_terminal_trees(model_outputs, model_outputs_ext,
                                 prediction_data, tree_num, nthreads);
        }
    }
}